

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O1

type __thiscall
PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)2>
          (Memory *this,Source segment,uint16_t offset)

{
  byte bVar1;
  uint uVar2;
  Segments *pSVar3;
  uint uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  
  pSVar3 = this->segments_;
  iVar5 = (int)CONCAT71(in_register_00000031,segment);
  if (iVar5 != 8) {
    if (iVar5 == 9) {
      pSVar3 = (Segments *)&pSVar3->cs_base_;
    }
    else if (iVar5 == 10) {
      pSVar3 = (Segments *)&pSVar3->ss_base_;
    }
    else {
      pSVar3 = (Segments *)&pSVar3->ds_base_;
    }
  }
  uVar2 = pSVar3->es_base_ + (uint)offset & 0xfffff;
  if (offset == 0xffff) {
    pSVar3 = this->segments_;
    if (segment != ES) {
      if (segment == CS) {
        pSVar3 = (Segments *)&pSVar3->cs_base_;
      }
      else if (segment == SS) {
        pSVar3 = (Segments *)&pSVar3->ss_base_;
      }
      else {
        pSVar3 = (Segments *)&pSVar3->ds_base_;
      }
    }
    uVar4 = pSVar3->es_base_ & 0xfffff;
    this->write_back_address_[0] = uVar2;
    this->write_back_address_[1] = uVar4;
    bVar1 = (this->memory)._M_elems[uVar2];
    uVar2 = (uint)(this->memory)._M_elems[uVar4];
  }
  else {
    if (uVar2 != 0xfffff) {
      return (type)((this->memory)._M_elems + uVar2);
    }
    this->write_back_address_[0] = 0xfffff;
    this->write_back_address_[1] = 0;
    bVar1 = (this->memory)._M_elems[0xfffff];
    uVar2 = *(uint *)(this->memory)._M_elems;
  }
  this->write_back_value_ = (ushort)(uVar2 << 8) | (ushort)bVar1;
  return &this->write_back_value_;
}

Assistant:

typename InstructionSet::x86::Accessor<IntT, type>::type access(InstructionSet::x86::Source segment, uint16_t offset) {
			const uint32_t physical_address = address(segment, offset);

			if constexpr (std::is_same_v<IntT, uint16_t>) {
				// If this is a 16-bit access that runs past the end of the segment, it'll wrap back
				// to the start. So the 16-bit value will need to be a local cache.
				if(offset == 0xffff) {
					return split_word<type>(physical_address, address(segment, 0));
				}
			}

			return access<IntT, type>(physical_address);
		}